

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

void pospopcnt_u8_avx512bw_popcnt4bit(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m512i x;
  __m512i x_00;
  __m512i x_01;
  __m512i x_02;
  __m512i x_03;
  __m512i x_04;
  __m512i x_05;
  __m512i x_06;
  __m512i b;
  __m512i b_00;
  __m512i b_01;
  __m512i b_02;
  __m512i b_03;
  __m512i b_04;
  __m512i b_05;
  __m512i b_06;
  __m512i a;
  __m512i a_00;
  __m512i a_01;
  __m512i a_02;
  __m512i a_03;
  __m512i a_04;
  __m512i a_05;
  __m512i a_06;
  uint64_t uVar3;
  uint32_t *in_RDX;
  ulong in_RSI;
  undefined1 (*in_RDI) [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [32];
  __m512i popcnt_h;
  __m512i popcnt_d;
  __m512i popcnt_g;
  __m512i popcnt_c;
  __m512i popcnt_f;
  __m512i popcnt_b;
  __m512i popcnt_e;
  __m512i popcnt_a;
  __m512i d3;
  __m512i d2;
  __m512i d1;
  __m512i d0;
  __m512i s3;
  __m512i s2;
  __m512i s1;
  __m512i s0;
  __m512i r3;
  __m512i r2;
  __m512i r1;
  __m512i r0;
  uint8_t *end;
  __m512i counter8bit_h;
  __m512i counter8bit_g;
  __m512i counter8bit_f;
  __m512i counter8bit_e;
  __m512i counter8bit_d;
  __m512i counter8bit_c;
  __m512i counter8bit_b;
  __m512i counter8bit_a;
  int local;
  __m512i lo_nibble;
  __m512i popcnt_4bit;
  __m512i counter_h;
  __m512i counter_g;
  __m512i counter_f;
  __m512i counter_e;
  __m512i counter_d;
  __m512i counter_c;
  __m512i counter_b;
  __m512i counter_a;
  __m512i zero;
  longlong in_stack_ffffffffffffd7f8;
  undefined1 in_stack_ffffffffffffd800 [56];
  longlong in_stack_ffffffffffffd838;
  undefined1 in_stack_ffffffffffffd840 [56];
  longlong in_stack_ffffffffffffd878;
  undefined1 in_stack_ffffffffffffd880 [56];
  undefined1 local_22c0 [64];
  undefined1 local_2280 [64];
  undefined1 local_2240 [64];
  undefined1 local_2200 [64];
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined1 local_2100 [64];
  int local_2084;
  undefined1 local_2000 [64];
  undefined1 local_1fc0 [64];
  undefined1 local_1f80 [64];
  undefined1 local_1f40 [64];
  undefined1 local_1f00 [64];
  undefined1 local_1ec0 [64];
  undefined1 local_1e80 [64];
  undefined1 local_1e40 [64];
  undefined1 (*local_1db0) [64];
  
  auVar4 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auVar4 = vmovdqa64_avx512f(auVar4);
  auVar4 = vmovdqa64_avx512f(auVar4);
  auVar5 = vmovdqa64_avx512f(auVar4);
  local_1e40 = vmovdqa64_avx512f(auVar5);
  auVar5 = vmovdqa64_avx512f(auVar4);
  local_1e80 = vmovdqa64_avx512f(auVar5);
  auVar5 = vmovdqa64_avx512f(auVar4);
  local_1ec0 = vmovdqa64_avx512f(auVar5);
  auVar5 = vmovdqa64_avx512f(auVar4);
  local_1f00 = vmovdqa64_avx512f(auVar5);
  auVar5 = vmovdqa64_avx512f(auVar4);
  local_1f40 = vmovdqa64_avx512f(auVar5);
  auVar5 = vmovdqa64_avx512f(auVar4);
  local_1f80 = vmovdqa64_avx512f(auVar5);
  auVar5 = vmovdqa64_avx512f(auVar4);
  local_1fc0 = vmovdqa64_avx512f(auVar5);
  auVar5 = vmovdqa64_avx512f(auVar4);
  local_2000 = vmovdqa64_avx512f(auVar5);
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x302020102010100),ZEXT816(0x403030203020201));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x302020102010100),ZEXT816(0x403030203020201));
  auVar17._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar17._16_16_ = ZEXT116(1) * auVar1;
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x302020102010100),ZEXT816(0x403030203020201));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x302020102010100),ZEXT816(0x403030203020201));
  auVar5 = vinserti64x4_avx512f
                     (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar1,
                                          ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2)),auVar17,1);
  auVar5 = vmovdqa64_avx512f(auVar5);
  auVar5 = vmovdqa64_avx512f(auVar5);
  auVar5 = vmovdqa64_avx512f(auVar5);
  auVar6 = vpbroadcastb_avx512bw(ZEXT116(0xf));
  auVar6 = vmovdqa64_avx512f(auVar6);
  auVar6 = vmovdqa64_avx512f(auVar6);
  auVar6 = vmovdqa64_avx512f(auVar6);
  local_2084 = 0;
  auVar7 = vmovdqa64_avx512f(auVar4);
  local_2100 = vmovdqa64_avx512f(auVar7);
  auVar7 = vmovdqa64_avx512f(auVar4);
  local_2140 = vmovdqa64_avx512f(auVar7);
  auVar7 = vmovdqa64_avx512f(auVar4);
  local_2180 = vmovdqa64_avx512f(auVar7);
  auVar7 = vmovdqa64_avx512f(auVar4);
  local_21c0 = vmovdqa64_avx512f(auVar7);
  auVar7 = vmovdqa64_avx512f(auVar4);
  local_2200 = vmovdqa64_avx512f(auVar7);
  auVar7 = vmovdqa64_avx512f(auVar4);
  local_2240 = vmovdqa64_avx512f(auVar7);
  auVar7 = vmovdqa64_avx512f(auVar4);
  local_2280 = vmovdqa64_avx512f(auVar7);
  auVar7 = vmovdqa64_avx512f(auVar4);
  local_22c0 = vmovdqa64_avx512f(auVar7);
  for (local_1db0 = in_RDI;
      local_1db0 != (undefined1 (*) [64])(*in_RDI + (in_RSI & 0xffffffffffffff00));
      local_1db0 = local_1db0 + 4) {
    auVar7 = vmovdqu64_avx512f(*local_1db0);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar8 = vmovdqu64_avx512f(local_1db0[1]);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqu64_avx512f(local_1db0[2]);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar10 = vmovdqu64_avx512f(local_1db0[3]);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar11 = vmovdqa64_avx512f(auVar7);
    vmovdqa64_avx512f(auVar8);
    a[1] = in_stack_ffffffffffffd880._0_8_;
    a[2] = in_stack_ffffffffffffd880._8_8_;
    a[3] = in_stack_ffffffffffffd880._16_8_;
    a[4] = in_stack_ffffffffffffd880._24_8_;
    a[5] = in_stack_ffffffffffffd880._32_8_;
    a[6] = in_stack_ffffffffffffd880._40_8_;
    a[7] = in_stack_ffffffffffffd880._48_8_;
    a[0] = in_stack_ffffffffffffd878;
    b[1] = in_stack_ffffffffffffd840._0_8_;
    b[2] = in_stack_ffffffffffffd840._8_8_;
    b[3] = in_stack_ffffffffffffd840._16_8_;
    b[4] = in_stack_ffffffffffffd840._24_8_;
    b[5] = in_stack_ffffffffffffd840._32_8_;
    b[6] = in_stack_ffffffffffffd840._40_8_;
    b[7] = in_stack_ffffffffffffd840._48_8_;
    b[0] = in_stack_ffffffffffffd838;
    avx512_merge1_even(a,b);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar7 = vmovdqa64_avx512f(auVar7);
    vmovdqa64_avx512f(auVar8);
    a_00[1] = in_stack_ffffffffffffd880._0_8_;
    a_00[2] = in_stack_ffffffffffffd880._8_8_;
    a_00[3] = in_stack_ffffffffffffd880._16_8_;
    a_00[4] = in_stack_ffffffffffffd880._24_8_;
    a_00[5] = in_stack_ffffffffffffd880._32_8_;
    a_00[6] = in_stack_ffffffffffffd880._40_8_;
    a_00[7] = in_stack_ffffffffffffd880._48_8_;
    a_00[0] = in_stack_ffffffffffffd878;
    b_00[1] = in_stack_ffffffffffffd840._0_8_;
    b_00[2] = in_stack_ffffffffffffd840._8_8_;
    b_00[3] = in_stack_ffffffffffffd840._16_8_;
    b_00[4] = in_stack_ffffffffffffd840._24_8_;
    b_00[5] = in_stack_ffffffffffffd840._32_8_;
    b_00[6] = in_stack_ffffffffffffd840._40_8_;
    b_00[7] = in_stack_ffffffffffffd840._48_8_;
    b_00[0] = in_stack_ffffffffffffd838;
    avx512_merge1_odd(a_00,b_00);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar8 = vmovdqa64_avx512f(auVar9);
    vmovdqa64_avx512f(auVar10);
    a_01[1] = in_stack_ffffffffffffd880._0_8_;
    a_01[2] = in_stack_ffffffffffffd880._8_8_;
    a_01[3] = in_stack_ffffffffffffd880._16_8_;
    a_01[4] = in_stack_ffffffffffffd880._24_8_;
    a_01[5] = in_stack_ffffffffffffd880._32_8_;
    a_01[6] = in_stack_ffffffffffffd880._40_8_;
    a_01[7] = in_stack_ffffffffffffd880._48_8_;
    a_01[0] = in_stack_ffffffffffffd878;
    b_01[1] = in_stack_ffffffffffffd840._0_8_;
    b_01[2] = in_stack_ffffffffffffd840._8_8_;
    b_01[3] = in_stack_ffffffffffffd840._16_8_;
    b_01[4] = in_stack_ffffffffffffd840._24_8_;
    b_01[5] = in_stack_ffffffffffffd840._32_8_;
    b_01[6] = in_stack_ffffffffffffd840._40_8_;
    b_01[7] = in_stack_ffffffffffffd840._48_8_;
    b_01[0] = in_stack_ffffffffffffd838;
    avx512_merge1_even(a_01,b_01);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqa64_avx512f(auVar9);
    vmovdqa64_avx512f(auVar10);
    a_02[1] = in_stack_ffffffffffffd880._0_8_;
    a_02[2] = in_stack_ffffffffffffd880._8_8_;
    a_02[3] = in_stack_ffffffffffffd880._16_8_;
    a_02[4] = in_stack_ffffffffffffd880._24_8_;
    a_02[5] = in_stack_ffffffffffffd880._32_8_;
    a_02[6] = in_stack_ffffffffffffd880._40_8_;
    a_02[7] = in_stack_ffffffffffffd880._48_8_;
    a_02[0] = in_stack_ffffffffffffd878;
    b_02[1] = in_stack_ffffffffffffd840._0_8_;
    b_02[2] = in_stack_ffffffffffffd840._8_8_;
    b_02[3] = in_stack_ffffffffffffd840._16_8_;
    b_02[4] = in_stack_ffffffffffffd840._24_8_;
    b_02[5] = in_stack_ffffffffffffd840._32_8_;
    b_02[6] = in_stack_ffffffffffffd840._40_8_;
    b_02[7] = in_stack_ffffffffffffd840._48_8_;
    b_02[0] = in_stack_ffffffffffffd838;
    avx512_merge1_odd(a_02,b_02);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar10 = vmovdqa64_avx512f(auVar11);
    vmovdqa64_avx512f(auVar8);
    a_03[1] = in_stack_ffffffffffffd880._0_8_;
    a_03[2] = in_stack_ffffffffffffd880._8_8_;
    a_03[3] = in_stack_ffffffffffffd880._16_8_;
    a_03[4] = in_stack_ffffffffffffd880._24_8_;
    a_03[5] = in_stack_ffffffffffffd880._32_8_;
    a_03[6] = in_stack_ffffffffffffd880._40_8_;
    a_03[7] = in_stack_ffffffffffffd880._48_8_;
    a_03[0] = in_stack_ffffffffffffd878;
    b_03[1] = in_stack_ffffffffffffd840._0_8_;
    b_03[2] = in_stack_ffffffffffffd840._8_8_;
    b_03[3] = in_stack_ffffffffffffd840._16_8_;
    b_03[4] = in_stack_ffffffffffffd840._24_8_;
    b_03[5] = in_stack_ffffffffffffd840._32_8_;
    b_03[6] = in_stack_ffffffffffffd840._40_8_;
    b_03[7] = in_stack_ffffffffffffd840._48_8_;
    b_03[0] = in_stack_ffffffffffffd838;
    avx512_merge2_even(a_03,b_03);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar12 = vmovdqa64_avx512f(auVar7);
    vmovdqa64_avx512f(auVar9);
    a_04[1] = in_stack_ffffffffffffd880._0_8_;
    a_04[2] = in_stack_ffffffffffffd880._8_8_;
    a_04[3] = in_stack_ffffffffffffd880._16_8_;
    a_04[4] = in_stack_ffffffffffffd880._24_8_;
    a_04[5] = in_stack_ffffffffffffd880._32_8_;
    a_04[6] = in_stack_ffffffffffffd880._40_8_;
    a_04[7] = in_stack_ffffffffffffd880._48_8_;
    a_04[0] = in_stack_ffffffffffffd878;
    b_04[1] = in_stack_ffffffffffffd840._0_8_;
    b_04[2] = in_stack_ffffffffffffd840._8_8_;
    b_04[3] = in_stack_ffffffffffffd840._16_8_;
    b_04[4] = in_stack_ffffffffffffd840._24_8_;
    b_04[5] = in_stack_ffffffffffffd840._32_8_;
    b_04[6] = in_stack_ffffffffffffd840._40_8_;
    b_04[7] = in_stack_ffffffffffffd840._48_8_;
    b_04[0] = in_stack_ffffffffffffd838;
    avx512_merge2_even(a_04,b_04);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar11 = vmovdqa64_avx512f(auVar11);
    vmovdqa64_avx512f(auVar8);
    a_05[1] = in_stack_ffffffffffffd880._0_8_;
    a_05[2] = in_stack_ffffffffffffd880._8_8_;
    a_05[3] = in_stack_ffffffffffffd880._16_8_;
    a_05[4] = in_stack_ffffffffffffd880._24_8_;
    a_05[5] = in_stack_ffffffffffffd880._32_8_;
    a_05[6] = in_stack_ffffffffffffd880._40_8_;
    a_05[7] = in_stack_ffffffffffffd880._48_8_;
    a_05[0] = in_stack_ffffffffffffd878;
    b_05[1] = in_stack_ffffffffffffd840._0_8_;
    b_05[2] = in_stack_ffffffffffffd840._8_8_;
    b_05[3] = in_stack_ffffffffffffd840._16_8_;
    b_05[4] = in_stack_ffffffffffffd840._24_8_;
    b_05[5] = in_stack_ffffffffffffd840._32_8_;
    b_05[6] = in_stack_ffffffffffffd840._40_8_;
    b_05[7] = in_stack_ffffffffffffd840._48_8_;
    b_05[0] = in_stack_ffffffffffffd838;
    avx512_merge2_odd(a_05,b_05);
    auVar8 = vmovdqa64_avx512f(auVar11);
    auVar7 = vmovdqa64_avx512f(auVar7);
    vmovdqa64_avx512f(auVar9);
    a_06[1] = in_stack_ffffffffffffd880._0_8_;
    a_06[2] = in_stack_ffffffffffffd880._8_8_;
    a_06[3] = in_stack_ffffffffffffd880._16_8_;
    a_06[4] = in_stack_ffffffffffffd880._24_8_;
    a_06[5] = in_stack_ffffffffffffd880._32_8_;
    a_06[6] = in_stack_ffffffffffffd880._40_8_;
    a_06[7] = in_stack_ffffffffffffd880._48_8_;
    a_06[0] = in_stack_ffffffffffffd878;
    b_06[1] = in_stack_ffffffffffffd840._0_8_;
    b_06[2] = in_stack_ffffffffffffd840._8_8_;
    b_06[3] = in_stack_ffffffffffffd840._16_8_;
    b_06[4] = in_stack_ffffffffffffd840._24_8_;
    b_06[5] = in_stack_ffffffffffffd840._32_8_;
    b_06[6] = in_stack_ffffffffffffd840._40_8_;
    b_06[7] = in_stack_ffffffffffffd840._48_8_;
    b_06[0] = in_stack_ffffffffffffd838;
    avx512_merge2_odd(a_06,b_06);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar9 = vmovdqa64_avx512f(auVar5);
    auVar11 = vmovdqa64_avx512f(auVar10);
    auVar11 = vpandq_avx512f(auVar11,auVar6);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar9 = vpshufb_avx512bw(auVar9,auVar11);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar11 = vmovdqa64_avx512f(auVar5);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vpsrld_avx512f(auVar10,ZEXT416(4));
    auVar13 = vpandq_avx512f(auVar10,auVar6);
    auVar10 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(auVar13);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar10 = vpshufb_avx512bw(auVar10,auVar11);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar11 = vmovdqa64_avx512f(auVar5);
    auVar13 = vmovdqa64_avx512f(auVar12);
    auVar13 = vpandq_avx512f(auVar13,auVar6);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar11 = vpshufb_avx512bw(auVar11,auVar13);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar13 = vmovdqa64_avx512f(auVar5);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vpsrld_avx512f(auVar12,ZEXT416(4));
    auVar14 = vpandq_avx512f(auVar12,auVar6);
    auVar12 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar14);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar12 = vpshufb_avx512bw(auVar12,auVar13);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar13 = vmovdqa64_avx512f(auVar5);
    auVar14 = vmovdqa64_avx512f(auVar8);
    auVar14 = vpandq_avx512f(auVar14,auVar6);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar13 = vpshufb_avx512bw(auVar13,auVar14);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar14 = vmovdqa64_avx512f(auVar5);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vpsrld_avx512f(auVar8,ZEXT416(4));
    auVar15 = vpandq_avx512f(auVar8,auVar6);
    auVar8 = vmovdqa64_avx512f(auVar14);
    auVar14 = vmovdqa64_avx512f(auVar15);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar8 = vpshufb_avx512bw(auVar8,auVar14);
    auVar8 = vmovdqa64_avx512f(auVar8);
    in_stack_ffffffffffffd880 = auVar8._0_56_;
    auVar14 = vmovdqa64_avx512f(auVar5);
    auVar15 = vmovdqa64_avx512f(auVar7);
    auVar15 = vpandq_avx512f(auVar15,auVar6);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar14 = vpshufb_avx512bw(auVar14,auVar15);
    auVar14 = vmovdqa64_avx512f(auVar14);
    in_stack_ffffffffffffd840 = auVar14._0_56_;
    in_stack_ffffffffffffd878 = auVar14._56_8_;
    auVar15 = vmovdqa64_avx512f(auVar5);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vpsrld_avx512f(auVar7,ZEXT416(4));
    auVar16 = vpandq_avx512f(auVar7,auVar6);
    auVar7 = vmovdqa64_avx512f(auVar15);
    auVar15 = vmovdqa64_avx512f(auVar16);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar7 = vpshufb_avx512bw(auVar7,auVar15);
    auVar7 = vmovdqa64_avx512f(auVar7);
    in_stack_ffffffffffffd800 = auVar7._0_56_;
    in_stack_ffffffffffffd838 = auVar7._56_8_;
    auVar15 = vmovdqa64_avx512f(local_2100);
    auVar16 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar15);
    auVar15 = vmovdqa64_avx512f(auVar16);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar9 = vpaddb_avx512bw(auVar9,auVar15);
    local_2100 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(local_2140);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar9 = vpaddb_avx512bw(auVar9,auVar11);
    local_2140 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(local_2180);
    auVar11 = vmovdqa64_avx512f(auVar13);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar9 = vpaddb_avx512bw(auVar9,auVar11);
    local_2180 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(local_21c0);
    auVar11 = vmovdqa64_avx512f(auVar14);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar9 = vpaddb_avx512bw(auVar9,auVar11);
    local_21c0 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(local_2200);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar9 = vpaddb_avx512bw(auVar9,auVar10);
    local_2200 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(local_2240);
    auVar10 = vmovdqa64_avx512f(auVar12);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar9 = vpaddb_avx512bw(auVar9,auVar10);
    local_2240 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(local_2280);
    auVar10 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar8 = vpaddb_avx512bw(auVar8,auVar9);
    local_2280 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(local_22c0);
    auVar9 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar9);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar7 = vpaddb_avx512bw(auVar7,auVar8);
    local_22c0 = vmovdqa64_avx512f(auVar7);
    local_2084 = local_2084 + 1;
    if (local_2084 == 0x3f) {
      auVar9 = vmovdqa64_avx512f(local_1e40);
      auVar7 = vmovdqa64_avx512f(local_2100);
      auVar8 = vmovdqa64_avx512f(auVar4);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vpsadbw_avx512bw(auVar7,auVar8);
      auVar7 = vmovdqa64_avx512f(auVar9);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vpaddq_avx512f(auVar7,auVar8);
      local_1e40 = vmovdqa64_avx512f(auVar7);
      auVar10 = ZEXT1664((undefined1  [16])0x0);
      in_stack_ffffffffffffd7f8 = 0;
      auVar7 = vmovdqa64_avx512f(auVar10);
      auVar7 = vmovdqa64_avx512f(auVar7);
      local_2100 = vmovdqa64_avx512f(auVar7);
      auVar9 = vmovdqa64_avx512f(local_1e80);
      auVar7 = vmovdqa64_avx512f(local_2140);
      auVar8 = vmovdqa64_avx512f(auVar4);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vpsadbw_avx512bw(auVar7,auVar8);
      auVar7 = vmovdqa64_avx512f(auVar9);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vpaddq_avx512f(auVar7,auVar8);
      local_1e80 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar10);
      auVar7 = vmovdqa64_avx512f(auVar7);
      local_2140 = vmovdqa64_avx512f(auVar7);
      auVar9 = vmovdqa64_avx512f(local_1ec0);
      auVar7 = vmovdqa64_avx512f(local_2180);
      auVar8 = vmovdqa64_avx512f(auVar4);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vpsadbw_avx512bw(auVar7,auVar8);
      auVar7 = vmovdqa64_avx512f(auVar9);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vpaddq_avx512f(auVar7,auVar8);
      local_1ec0 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar10);
      auVar7 = vmovdqa64_avx512f(auVar7);
      local_2180 = vmovdqa64_avx512f(auVar7);
      auVar9 = vmovdqa64_avx512f(local_1f00);
      auVar7 = vmovdqa64_avx512f(local_21c0);
      auVar8 = vmovdqa64_avx512f(auVar4);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vpsadbw_avx512bw(auVar7,auVar8);
      auVar7 = vmovdqa64_avx512f(auVar9);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vpaddq_avx512f(auVar7,auVar8);
      local_1f00 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar10);
      auVar7 = vmovdqa64_avx512f(auVar7);
      local_21c0 = vmovdqa64_avx512f(auVar7);
      auVar9 = vmovdqa64_avx512f(local_1f40);
      auVar7 = vmovdqa64_avx512f(local_2200);
      auVar8 = vmovdqa64_avx512f(auVar4);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vpsadbw_avx512bw(auVar7,auVar8);
      auVar7 = vmovdqa64_avx512f(auVar9);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vpaddq_avx512f(auVar7,auVar8);
      local_1f40 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar10);
      auVar7 = vmovdqa64_avx512f(auVar7);
      local_2200 = vmovdqa64_avx512f(auVar7);
      auVar9 = vmovdqa64_avx512f(local_1f80);
      auVar7 = vmovdqa64_avx512f(local_2240);
      auVar8 = vmovdqa64_avx512f(auVar4);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vpsadbw_avx512bw(auVar7,auVar8);
      auVar7 = vmovdqa64_avx512f(auVar9);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vpaddq_avx512f(auVar7,auVar8);
      local_1f80 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar10);
      auVar7 = vmovdqa64_avx512f(auVar7);
      local_2240 = vmovdqa64_avx512f(auVar7);
      auVar9 = vmovdqa64_avx512f(local_1fc0);
      auVar7 = vmovdqa64_avx512f(local_2280);
      auVar8 = vmovdqa64_avx512f(auVar4);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vpsadbw_avx512bw(auVar7,auVar8);
      auVar7 = vmovdqa64_avx512f(auVar9);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vpaddq_avx512f(auVar7,auVar8);
      local_1fc0 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar10);
      auVar7 = vmovdqa64_avx512f(auVar7);
      local_2280 = vmovdqa64_avx512f(auVar7);
      auVar9 = vmovdqa64_avx512f(local_2000);
      auVar7 = vmovdqa64_avx512f(local_22c0);
      auVar8 = vmovdqa64_avx512f(auVar4);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vpsadbw_avx512bw(auVar7,auVar8);
      auVar7 = vmovdqa64_avx512f(auVar9);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vpaddq_avx512f(auVar7,auVar8);
      local_2000 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar10);
      auVar7 = vmovdqa64_avx512f(auVar7);
      local_22c0 = vmovdqa64_avx512f(auVar7);
      local_2084 = 0;
    }
  }
  if (local_2084 != 0) {
    auVar7 = vmovdqa64_avx512f(local_1e40);
    auVar5 = vmovdqa64_avx512f(local_2100);
    auVar6 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vpsadbw_avx512bw(auVar5,auVar6);
    auVar5 = vmovdqa64_avx512f(auVar7);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpaddq_avx512f(auVar5,auVar6);
    local_1e40 = vmovdqa64_avx512f(auVar5);
    auVar7 = vmovdqa64_avx512f(local_1e80);
    auVar5 = vmovdqa64_avx512f(local_2140);
    auVar6 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vpsadbw_avx512bw(auVar5,auVar6);
    auVar5 = vmovdqa64_avx512f(auVar7);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpaddq_avx512f(auVar5,auVar6);
    local_1e80 = vmovdqa64_avx512f(auVar5);
    auVar7 = vmovdqa64_avx512f(local_1ec0);
    auVar5 = vmovdqa64_avx512f(local_2180);
    auVar6 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vpsadbw_avx512bw(auVar5,auVar6);
    auVar5 = vmovdqa64_avx512f(auVar7);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpaddq_avx512f(auVar5,auVar6);
    local_1ec0 = vmovdqa64_avx512f(auVar5);
    auVar7 = vmovdqa64_avx512f(local_1f00);
    auVar5 = vmovdqa64_avx512f(local_21c0);
    auVar6 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vpsadbw_avx512bw(auVar5,auVar6);
    auVar5 = vmovdqa64_avx512f(auVar7);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpaddq_avx512f(auVar5,auVar6);
    local_1f00 = vmovdqa64_avx512f(auVar5);
    auVar7 = vmovdqa64_avx512f(local_1f40);
    auVar5 = vmovdqa64_avx512f(local_2200);
    auVar6 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vpsadbw_avx512bw(auVar5,auVar6);
    auVar5 = vmovdqa64_avx512f(auVar7);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpaddq_avx512f(auVar5,auVar6);
    local_1f40 = vmovdqa64_avx512f(auVar5);
    auVar7 = vmovdqa64_avx512f(local_1f80);
    auVar5 = vmovdqa64_avx512f(local_2240);
    auVar6 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vpsadbw_avx512bw(auVar5,auVar6);
    auVar5 = vmovdqa64_avx512f(auVar7);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpaddq_avx512f(auVar5,auVar6);
    local_1f80 = vmovdqa64_avx512f(auVar5);
    auVar7 = vmovdqa64_avx512f(local_1fc0);
    auVar5 = vmovdqa64_avx512f(local_2280);
    auVar6 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vpsadbw_avx512bw(auVar5,auVar6);
    auVar5 = vmovdqa64_avx512f(auVar7);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpaddq_avx512f(auVar5,auVar6);
    local_1fc0 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(local_2000);
    auVar5 = vmovdqa64_avx512f(local_22c0);
    auVar7 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar7);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpsadbw_avx512bw(auVar4,auVar5);
    auVar4 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar4 = vpaddq_avx512f(auVar4,auVar5);
    local_2000 = vmovdqa64_avx512f(auVar4);
  }
  vmovdqa64_avx512f(local_1e40);
  x[1] = in_stack_ffffffffffffd800._0_8_;
  x[2] = in_stack_ffffffffffffd800._8_8_;
  x[3] = in_stack_ffffffffffffd800._16_8_;
  x[4] = in_stack_ffffffffffffd800._24_8_;
  x[5] = in_stack_ffffffffffffd800._32_8_;
  x[6] = in_stack_ffffffffffffd800._40_8_;
  x[7] = in_stack_ffffffffffffd800._48_8_;
  x[0] = in_stack_ffffffffffffd7f8;
  uVar3 = avx512_sum_epu64(x);
  *in_RDX = *in_RDX + (int)uVar3;
  vmovdqa64_avx512f(local_1e80);
  x_00[1] = in_stack_ffffffffffffd800._0_8_;
  x_00[2] = in_stack_ffffffffffffd800._8_8_;
  x_00[3] = in_stack_ffffffffffffd800._16_8_;
  x_00[4] = in_stack_ffffffffffffd800._24_8_;
  x_00[5] = in_stack_ffffffffffffd800._32_8_;
  x_00[6] = in_stack_ffffffffffffd800._40_8_;
  x_00[7] = in_stack_ffffffffffffd800._48_8_;
  x_00[0] = in_stack_ffffffffffffd7f8;
  uVar3 = avx512_sum_epu64(x_00);
  in_RDX[1] = in_RDX[1] + (int)uVar3;
  vmovdqa64_avx512f(local_1ec0);
  x_01[1] = in_stack_ffffffffffffd800._0_8_;
  x_01[2] = in_stack_ffffffffffffd800._8_8_;
  x_01[3] = in_stack_ffffffffffffd800._16_8_;
  x_01[4] = in_stack_ffffffffffffd800._24_8_;
  x_01[5] = in_stack_ffffffffffffd800._32_8_;
  x_01[6] = in_stack_ffffffffffffd800._40_8_;
  x_01[7] = in_stack_ffffffffffffd800._48_8_;
  x_01[0] = in_stack_ffffffffffffd7f8;
  uVar3 = avx512_sum_epu64(x_01);
  in_RDX[2] = in_RDX[2] + (int)uVar3;
  vmovdqa64_avx512f(local_1f00);
  x_02[1] = in_stack_ffffffffffffd800._0_8_;
  x_02[2] = in_stack_ffffffffffffd800._8_8_;
  x_02[3] = in_stack_ffffffffffffd800._16_8_;
  x_02[4] = in_stack_ffffffffffffd800._24_8_;
  x_02[5] = in_stack_ffffffffffffd800._32_8_;
  x_02[6] = in_stack_ffffffffffffd800._40_8_;
  x_02[7] = in_stack_ffffffffffffd800._48_8_;
  x_02[0] = in_stack_ffffffffffffd7f8;
  uVar3 = avx512_sum_epu64(x_02);
  in_RDX[3] = in_RDX[3] + (int)uVar3;
  vmovdqa64_avx512f(local_1f40);
  x_03[1] = in_stack_ffffffffffffd800._0_8_;
  x_03[2] = in_stack_ffffffffffffd800._8_8_;
  x_03[3] = in_stack_ffffffffffffd800._16_8_;
  x_03[4] = in_stack_ffffffffffffd800._24_8_;
  x_03[5] = in_stack_ffffffffffffd800._32_8_;
  x_03[6] = in_stack_ffffffffffffd800._40_8_;
  x_03[7] = in_stack_ffffffffffffd800._48_8_;
  x_03[0] = in_stack_ffffffffffffd7f8;
  uVar3 = avx512_sum_epu64(x_03);
  in_RDX[4] = in_RDX[4] + (int)uVar3;
  vmovdqa64_avx512f(local_1f80);
  x_04[1] = in_stack_ffffffffffffd800._0_8_;
  x_04[2] = in_stack_ffffffffffffd800._8_8_;
  x_04[3] = in_stack_ffffffffffffd800._16_8_;
  x_04[4] = in_stack_ffffffffffffd800._24_8_;
  x_04[5] = in_stack_ffffffffffffd800._32_8_;
  x_04[6] = in_stack_ffffffffffffd800._40_8_;
  x_04[7] = in_stack_ffffffffffffd800._48_8_;
  x_04[0] = in_stack_ffffffffffffd7f8;
  uVar3 = avx512_sum_epu64(x_04);
  in_RDX[5] = in_RDX[5] + (int)uVar3;
  vmovdqa64_avx512f(local_1fc0);
  x_05[1] = in_stack_ffffffffffffd800._0_8_;
  x_05[2] = in_stack_ffffffffffffd800._8_8_;
  x_05[3] = in_stack_ffffffffffffd800._16_8_;
  x_05[4] = in_stack_ffffffffffffd800._24_8_;
  x_05[5] = in_stack_ffffffffffffd800._32_8_;
  x_05[6] = in_stack_ffffffffffffd800._40_8_;
  x_05[7] = in_stack_ffffffffffffd800._48_8_;
  x_05[0] = in_stack_ffffffffffffd7f8;
  uVar3 = avx512_sum_epu64(x_05);
  in_RDX[6] = in_RDX[6] + (int)uVar3;
  vmovdqa64_avx512f(local_2000);
  x_06[1] = in_stack_ffffffffffffd800._0_8_;
  x_06[2] = in_stack_ffffffffffffd800._8_8_;
  x_06[3] = in_stack_ffffffffffffd800._16_8_;
  x_06[4] = in_stack_ffffffffffffd800._24_8_;
  x_06[5] = in_stack_ffffffffffffd800._32_8_;
  x_06[6] = in_stack_ffffffffffffd800._40_8_;
  x_06[7] = in_stack_ffffffffffffd800._48_8_;
  x_06[0] = in_stack_ffffffffffffd7f8;
  uVar3 = avx512_sum_epu64(x_06);
  in_RDX[7] = in_RDX[7] + (int)uVar3;
  pospopcnt_u8_scalar_naive((uint8_t *)local_1db0,in_RSI & 0xff,in_RDX);
  return;
}

Assistant:

void pospopcnt_u8_avx512bw_popcnt4bit(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m512i zero = _mm512_setzero_si512();

    __m512i counter_a = zero;
    __m512i counter_b = zero;
    __m512i counter_c = zero;
    __m512i counter_d = zero;
    __m512i counter_e = zero;
    __m512i counter_f = zero;
    __m512i counter_g = zero;
    __m512i counter_h = zero;

    const __m512i popcnt_4bit = _mm512_setr_epi64(
        0x0302020102010100llu, 0x0403030203020201llu,
        0x0302020102010100llu, 0x0403030203020201llu,
        0x0302020102010100llu, 0x0403030203020201llu,
        0x0302020102010100llu, 0x0403030203020201llu
    );

    const __m512i lo_nibble = _mm512_set1_epi8(0x0f);

    int local = 0;
    __m512i counter8bit_a = zero;
    __m512i counter8bit_b = zero;
    __m512i counter8bit_c = zero;
    __m512i counter8bit_d = zero;
    __m512i counter8bit_e = zero;
    __m512i counter8bit_f = zero;
    __m512i counter8bit_g = zero;
    __m512i counter8bit_h = zero;

    for (const uint8_t* end = &data[len & ~(4*64 - 1)]; data != end; data += 4*64) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m512i r0 = _mm512_loadu_si512((__m512i*)&data[0*64]);
        const __m512i r1 = _mm512_loadu_si512((__m512i*)&data[1*64]);
        const __m512i r2 = _mm512_loadu_si512((__m512i*)&data[2*64]);
        const __m512i r3 = _mm512_loadu_si512((__m512i*)&data[3*64]);

        // s0 = [a0|a1|c0|c1|e0|e1|g0|g1]
        // s1 = [b0|b1|d0|d1|f0|f1|h0|h1]
        // s2 = [a2|a3|c2|c3|e2|e3|g2|g3]
        // s3 = [b2|b3|d2|d3|f2|f3|h2|h3]
        const __m512i s0 = avx512_merge1_even(r0, r1);
        const __m512i s1 = avx512_merge1_odd (r0, r1);
        const __m512i s2 = avx512_merge1_even(r2, r3);
        const __m512i s3 = avx512_merge1_odd (r2, r3);

        // d0 = [a0|a1|a2|a3|e0|e1|e2|e3]
        // d1 = [b0|b1|b2|b3|f0|f1|f2|f3]
        // d2 = [c0|c1|c2|c3|g0|g1|g2|g3]
        // d3 = [d0|d1|d2|d3|h0|h1|h2|h3]
        const __m512i d0 = avx512_merge2_even(s0, s2);
        const __m512i d1 = avx512_merge2_even(s1, s3);
        const __m512i d2 = avx512_merge2_odd (s0, s2);
        const __m512i d3 = avx512_merge2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m512i popcnt_a = _mm512_shuffle_epi8(popcnt_4bit, d0 & lo_nibble);
        const __m512i popcnt_e = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d0, 4) & lo_nibble);
        const __m512i popcnt_b = _mm512_shuffle_epi8(popcnt_4bit, d1 & lo_nibble);
        const __m512i popcnt_f = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d1, 4) & lo_nibble);
        const __m512i popcnt_c = _mm512_shuffle_epi8(popcnt_4bit, d2 & lo_nibble);
        const __m512i popcnt_g = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d2, 4) & lo_nibble);
        const __m512i popcnt_d = _mm512_shuffle_epi8(popcnt_4bit, d3 & lo_nibble);
        const __m512i popcnt_h = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d3, 4) & lo_nibble);

        counter8bit_a = _mm512_add_epi8(counter8bit_a, popcnt_a);
        counter8bit_b = _mm512_add_epi8(counter8bit_b, popcnt_b);
        counter8bit_c = _mm512_add_epi8(counter8bit_c, popcnt_c);
        counter8bit_d = _mm512_add_epi8(counter8bit_d, popcnt_d);
        counter8bit_e = _mm512_add_epi8(counter8bit_e, popcnt_e);
        counter8bit_f = _mm512_add_epi8(counter8bit_f, popcnt_f);
        counter8bit_g = _mm512_add_epi8(counter8bit_g, popcnt_g);
        counter8bit_h = _mm512_add_epi8(counter8bit_h, popcnt_h);

        local += 1;
        if (local == 63) {
            // avoid overflows in the 8-bit counters
#define U(n) \
            counter_##n = _mm512_add_epi64(counter_##n, _mm512_sad_epu8(counter8bit_##n, zero)); \
            counter8bit_##n = _mm512_setzero_si512();

            U(a) U(b) U(c) U(d)
            U(e) U(f) U(g) U(h)
#undef U
            local = 0;
        }
    }

    if (local != 0) {
#define U(n) counter_##n = _mm512_add_epi64(counter_##n, _mm512_sad_epu8(counter8bit_##n, zero));
        U(a) U(b) U(c) U(d)
        U(e) U(f) U(g) U(h)
#undef U
    }

    flag_counts[0] += avx512_sum_epu64(counter_a);
    flag_counts[1] += avx512_sum_epu64(counter_b);
    flag_counts[2] += avx512_sum_epu64(counter_c);
    flag_counts[3] += avx512_sum_epu64(counter_d);
    flag_counts[4] += avx512_sum_epu64(counter_e);
    flag_counts[5] += avx512_sum_epu64(counter_f);
    flag_counts[6] += avx512_sum_epu64(counter_g);
    flag_counts[7] += avx512_sum_epu64(counter_h);

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % (4*64), flag_counts);
}